

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input-xkb.c
# Opt level: O3

uint32_t wpe_input_xkb_context_get_key_code
                   (wpe_input_xkb_context *xkb_context,uint32_t hardware_key_code,_Bool pressed)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  
  wpe_input_xkb_context_try_ensure_keymap(xkb_context);
  uVar4 = 0;
  uVar3 = uVar4;
  if ((xkb_context->state != (xkb_state *)0x0) &&
     (uVar1 = xkb_state_key_get_one_sym(xkb_context->state,hardware_key_code), uVar3 = uVar1,
     pressed)) {
    wpe_input_xkb_context_try_ensure_compose_table(xkb_context);
    if (((xkb_context->compose_state != (xkb_compose_state *)0x0) &&
        (((iVar2 = xkb_compose_state_feed(xkb_context->compose_state,uVar1), iVar2 == 1 &&
          (iVar2 = xkb_compose_state_get_status(xkb_context->compose_state), uVar3 = uVar4,
          iVar2 != 1)) && (iVar2 != 3)))) && (uVar3 = uVar1, iVar2 == 2)) {
      uVar3 = xkb_compose_state_get_one_sym(xkb_context->compose_state);
      return uVar3;
    }
  }
  return uVar3;
}

Assistant:

uint32_t
wpe_input_xkb_context_get_key_code(struct wpe_input_xkb_context* xkb_context, uint32_t hardware_key_code, bool pressed)
{
    wpe_input_xkb_context_try_ensure_keymap(xkb_context);
    if (!xkb_context->state)
        return 0;

    uint32_t sym = xkb_state_key_get_one_sym(xkb_context->state, hardware_key_code);
    if (!pressed)
        return sym;

    wpe_input_xkb_context_try_ensure_compose_table(xkb_context);
    if (!xkb_context->compose_state)
        return sym;

    if (xkb_compose_state_feed(xkb_context->compose_state, sym) != XKB_COMPOSE_FEED_ACCEPTED)
        return sym;

    switch (xkb_compose_state_get_status(xkb_context->compose_state)) {
    case XKB_COMPOSE_COMPOSING:
    case XKB_COMPOSE_CANCELLED:
        return 0;
    case XKB_COMPOSE_COMPOSED:
        return xkb_compose_state_get_one_sym(xkb_context->compose_state);
    case XKB_COMPOSE_NOTHING:
    default:
        break;
    }

    return sym;
}